

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O3

void __thiscall pass_insert_clk_en_Test::~pass_insert_clk_en_Test(pass_insert_clk_en_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, insert_clk_en) {  // NOLINT
    Context c;
    auto &parent = c.generator("parent");
    auto &clk = parent.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst = parent.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    auto &a = parent.port(PortDirection::Out, "a", 1);

    auto seq = parent.sequential();
    seq->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
    seq->add_condition({EventEdgeType::Posedge, rst.shared_from_this()});
    auto if_ = std::make_shared<IfStmt>(rst);
    if_->add_then_stmt(a.assign(constant(1, 1)));
    if_->add_else_stmt(a.assign(constant(0, 1)));
    seq->add_stmt(if_);

    // add child generator
    auto &child = c.generator("child");
    auto &clk_child = child.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto child_seq = child.sequential();
    child_seq->add_condition({EventEdgeType::Posedge, clk_child.shared_from_this()});
    child_seq->add_stmt(child.var("a", 1).assign(constant(1, 1)));
    child_seq->add_stmt(child.var("b", 1).assign(constant(1, 1)));

    // another child generator
    auto &child2 = c.generator("child2");
    auto &clk_child2 = child2.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &clk_en_child2 = child2.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    // always const
    child2.wire(clk_en_child2, constant(1, 1));
    auto child_seq2 = child2.sequential();
    child_seq2->add_condition({EventEdgeType::Posedge, clk_child2.shared_from_this()});
    auto if_child2 = std::make_shared<IfStmt>(clk_en_child2);
    if_child2->add_then_stmt(child2.var("a", 1).assign(constant(1, 1)));
    child_seq2->add_stmt(if_child2);

    auto &child3 = c.generator("child3");
    auto &clk_child3 = child3.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &clk_en_child3 = child3.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    auto child_seq3 = child3.sequential();
    child_seq2->add_condition({EventEdgeType::Posedge, clk_child3.shared_from_this()});
    auto if_child3 = std::make_shared<IfStmt>(clk_en_child3);
    if_child3->add_then_stmt(child3.var("a", 1).assign(constant(1, 1)));
    child_seq3->add_stmt(if_child3);

    parent.add_child_generator("child", child.shared_from_this());
    parent.add_child_generator("child2", child2.shared_from_this());
    parent.add_child_generator("child3", child3.shared_from_this());
    parent.wire(clk_child, clk);
    parent.wire(clk_child2, clk);
    parent.wire(clk_child3, clk);

    // add clock enable
    auto &parent_clk_en = parent.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    // wire it to child3
    parent.wire(clk_en_child3, parent_clk_en);
    auto_insert_clock_enable(&parent);
    fix_assignment_type(&parent);
    create_module_instantiation(&parent);
    auto src = generate_verilog(&parent);
    EXPECT_TRUE(src.find("parent") != src.end());
    EXPECT_TRUE(src.find("child") != src.end());
    EXPECT_TRUE(src.find("child2") != src.end());
    EXPECT_TRUE(src.find("child3") != src.end());
    auto parent_src = src.at("parent");
    auto child_src = src.at("child");
    auto child_src2 = src.at("child2");
    EXPECT_TRUE(parent_src.find("else if (clk_en)") != std::string::npos);
    EXPECT_TRUE(child_src.find("if (clk_en)") != std::string::npos);
    EXPECT_TRUE(child_src2.find("if (clk_en)") != std::string::npos);
}